

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcFont.cpp
# Opt level: O0

int __thiscall GrcFont::ScanGlyfIds(GrcFont *this)

{
  bool bVar1;
  int *piVar2;
  iterator *in_RDI;
  int nPrevUni;
  utf16 gid_1;
  iterator fitEnd;
  iterator fit;
  int ig;
  uint *prgnUsed;
  utf16 gid;
  bool fInUsedRange;
  uint nUni;
  GdlObject *in_stack_ffffffffffffff48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff50;
  GrcFont *in_stack_ffffffffffffff58;
  allocator *paVar3;
  uint local_90;
  ushort local_8a;
  iterator local_88;
  iterator local_78;
  GrcFont *in_stack_ffffffffffffff98;
  GdlObject *in_stack_ffffffffffffffa0;
  int local_58;
  int in_stack_ffffffffffffffac;
  GrcErrorList *in_stack_ffffffffffffffb0;
  allocator local_41;
  string local_40 [32];
  void *local_20;
  utf16 local_18;
  byte local_15;
  uint local_14;
  int local_4;
  
  if (*(int *)&(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&in_RDI[0xc].m_pfont)
               ->_M_impl).super__Vector_impl_data._M_start == -1) {
    local_15 = 0;
    in_RDI[0xf].m_nUni = 0;
    for (local_14 = 0; local_14 < 0x10fffe; local_14 = local_14 + 1) {
      if ((local_14 == 0xfffe) || (local_14 == 0xffff)) {
        local_18 = 0;
      }
      else {
        local_18 = GlyphFromCmap(in_stack_ffffffffffffff58,
                                 (uint)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                                 in_stack_ffffffffffffff48);
      }
      if ((local_18 == 0) || ((local_15 & 1) != 0)) {
        if ((local_18 == 0) && ((local_15 & 1) != 0)) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI,
                     (value_type_conflict *)in_stack_ffffffffffffff58);
          local_15 = 0;
        }
      }
      else {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI,
                   (value_type_conflict *)in_stack_ffffffffffffff58);
        local_15 = 1;
      }
      if (local_18 != 0) {
        in_RDI[0xf].m_nUni = in_RDI[0xf].m_nUni + 1;
      }
    }
    if ((local_15 & 1) != 0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI,
                 (value_type_conflict *)in_stack_ffffffffffffff58);
    }
    local_20 = operator_new__(0x40000);
    if (local_20 == (void *)0x0) {
      paVar3 = &local_41;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_40,"Memory failure: could not allocate prgUsed array when scanning glyph ids"
                 ,paVar3);
      GrcErrorList::AddError
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0,
                 (string *)in_stack_ffffffffffffff98);
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      local_4 = 0;
    }
    else {
      for (local_58 = 0; local_58 < 0xffff; local_58 = local_58 + 1) {
        *(undefined4 *)((long)local_20 + (long)local_58 * 4) = 0;
      }
      *(undefined4 *)
       &(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&in_RDI[0xc].m_pfont)->
        _M_impl).super__Vector_impl_data._M_start = 0;
      iterator::iterator((iterator *)&stack0xffffffffffffff98);
      local_78 = End((GrcFont *)0x1b2190);
      local_88 = Begin((GrcFont *)0x1b21a4);
      while (bVar1 = iterator::operator!=((iterator *)&stack0xffffffffffffff98,&local_78), bVar1) {
        local_14 = iterator::operator*((iterator *)&stack0xffffffffffffff98);
        local_8a = GlyphFromCmap(in_stack_ffffffffffffff58,
                                 (uint)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                                 in_stack_ffffffffffffff48);
        if (local_8a != 0) {
          local_90 = (uint)local_8a;
          piVar2 = std::max<int>((int *)(in_RDI + 0xc),(int *)&local_90);
          *(int *)&(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                    &in_RDI[0xc].m_pfont)->_M_impl).super__Vector_impl_data._M_start = *piVar2;
          if (*(int *)((long)local_20 + (ulong)local_8a * 4) == 0) {
            *(uint *)((long)local_20 + (ulong)local_8a * 4) = local_14;
          }
          else {
            if (*(int *)((long)local_20 + (ulong)local_8a * 4) != 0xffff) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (in_stack_ffffffffffffff50,(value_type_conflict *)in_stack_ffffffffffffff48)
              ;
              *(undefined4 *)((long)local_20 + (ulong)local_8a * 4) = 0xffff;
            }
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI,
                       (value_type_conflict *)in_stack_ffffffffffffff58);
          }
        }
        iterator::operator++(in_RDI);
      }
      if (local_20 != (void *)0x0) {
        operator_delete__(local_20);
      }
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int GrcFont::ScanGlyfIds(void)
{
	Assert(m_pCmap_3_10 || m_pCmap_3_1);
	if (m_nMaxGlyfId != -1) // return if called more than once
		return true;

	// determine ranges of Unicode codepoints supported by this font
	// TODO: is there a more efficient way to do this?

	unsigned int nUni;
	bool fInUsedRange = false;
	m_cnUnicode = 0;
	for (nUni = 0; nUni <= 0x0010FFFD; nUni++)
	{
		utf16 gid;
		if (nUni == 0x0000FFFE || nUni == 0x0000FFFF) // invalid
			gid = 0;
		else
			gid = GlyphFromCmap(nUni, NULL);

        if (gid != 0 && !fInUsedRange)
		{
			// Record the beginning of the range
			m_vnMinUnicode.push_back(nUni);
			fInUsedRange = true;
		}
		else if (gid == 0 && fInUsedRange)
		{
			// Record the end of the range.
			m_vnLimUnicode.push_back(nUni);
			fInUsedRange = false;
		}
		if (gid != 0)
			m_cnUnicode++;
	}
	if (fInUsedRange)
		m_vnLimUnicode.push_back(nUni);
	Assert(m_vnLimUnicode.size() == m_vnMinUnicode.size());

	// create array indexed by glyf id containing unicode codepoints
	unsigned int *prgnUsed = new unsigned int[0x10000];
	if (!prgnUsed)
	{
		g_errorList.AddError(129, NULL,
			"Memory failure: could not allocate prgUsed array when scanning glyph ids");
		return false;
	}
	// initialize all elements to zero
	for (int ig = 0; ig < 0xFFFF; ig++)
		prgnUsed[ig] = 0;
	m_nMaxGlyfId = 0;

	// get glyf id for all unicode codepoints and look for collisions
	GrcFont::iterator fit;
	GrcFont::iterator fitEnd = this->End();
	for (fit = this->Begin(); fit != fitEnd; ++fit)
	{
		nUni = *fit;
		Assert(nUni != 0x0000FFFE);  // invalid
		Assert(nUni != 0x0000FFFF);  // invalid
		Assert(nUni != 0x0010FFFE);  // invalid
		Assert(nUni != 0x0010FFFF);  // invalid

		utf16 gid = GlyphFromCmap(nUni, NULL); // find glyf id
		if (gid == 0) // 0 - normally is default glyf id
		{
			Assert(false); // iterators only cover codepoints with valid glyph IDs
			continue;
		}
		m_nMaxGlyfId = max(m_nMaxGlyfId, static_cast<int>(gid)); // track largest glyf id
		if (!prgnUsed[gid]) // if this glyf id not seen yet
		{
			prgnUsed[gid] = nUni; // store current unicode id
		}
		else
		{
			// track Unicode ids that collide
			int nPrevUni = prgnUsed[gid];
			if (nPrevUni != 0x0000FFFF) 
			{
				// first collision - need to store both Unicode ids in array and current id
				m_vnCollisions.push_back(nPrevUni);
				// indicate one collision occurred, don't want to store array id if another
				// collision occurs; 0xFFFF is an illegal unicode value
				prgnUsed[gid] = 0x0000FFFF; 
			}
			m_vnCollisions.push_back(nUni); // store current unicode id always
		}
	}
	delete [] prgnUsed;
	return true;
}